

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QSize __thiscall QToolBarAreaLayoutLine::sizeHint(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  int iVar1;
  int iVar2;
  QToolBarAreaLayoutItem *pQVar3;
  bool bVar4;
  QSize QVar5;
  QSize QVar6;
  Representation RVar7;
  int iVar8;
  Representation RVar9;
  long lVar10;
  int i;
  ulong uVar11;
  
  lVar10 = 0;
  iVar8 = 0;
  iVar1 = 0;
  for (uVar11 = 0; uVar11 < (ulong)(this->toolBarItems).d.size; uVar11 = uVar11 + 1) {
    pQVar3 = (this->toolBarItems).d.ptr;
    this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar3->widgetItem + lVar10);
    bVar4 = QToolBarAreaLayoutItem::skip(this_00);
    RVar9.m_i = iVar8;
    if (!bVar4) {
      QVar5 = QToolBarAreaLayoutItem::sizeHint(this_00);
      QVar6 = (QSize)((ulong)QVar5 >> 0x20);
      if (this->o == Horizontal) {
        QVar6 = QVar5;
      }
      iVar2 = *(int *)((long)&pQVar3->preferredSize + lVar10);
      RVar9.m_i = QVar6.wd.m_i.m_i;
      if (0 < iVar2) {
        RVar9.m_i = iVar2;
      }
      iVar1 = iVar1 + RVar9.m_i;
      RVar9 = QVar5.ht.m_i;
      if (this->o == Vertical) {
        RVar9 = QVar5.wd.m_i;
      }
      if (RVar9.m_i < iVar8) {
        RVar9.m_i = iVar8;
      }
    }
    iVar8 = RVar9.m_i;
    lVar10 = lVar10 + 0x18;
  }
  RVar9.m_i = iVar1;
  RVar7.m_i = iVar8;
  if ((this->o != Horizontal) && (RVar9.m_i = iVar8, RVar7.m_i = iVar1, this->o != Vertical)) {
    RVar9.m_i = -1;
    RVar7.m_i = iVar8;
  }
  QVar6.ht.m_i = RVar7.m_i;
  QVar6.wd.m_i = RVar9.m_i;
  return QVar6;
}

Assistant:

QSize QToolBarAreaLayoutLine::sizeHint() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems.at(i);
        if (item.skip())
            continue;

        QSize sh = item.sizeHint();
        a += item.preferredSize > 0 ? item.preferredSize : pick(o, sh);
        b = qMax(b, perp(o, sh));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}